

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O1

RSIZE countfword(void)

{
  int iVar1;
  line *plVar2;
  mgwin *pmVar3;
  int iVar4;
  line *plVar5;
  RSIZE RVar6;
  
  plVar2 = curwp->w_dotp;
  iVar1 = curwp->w_doto;
  RVar6 = 0;
  if (iVar1 != plVar2->l_used) {
    RVar6 = 0;
    plVar5 = plVar2;
    iVar4 = iVar1;
    do {
      if ((cinfo[(byte)plVar5->l_text[iVar4]] & 1U) == 0) break;
      iVar4 = forwchar(8,1);
      if (iVar4 == 0) break;
      RVar6 = RVar6 + 1;
      iVar4 = curwp->w_doto;
      plVar5 = curwp->w_dotp;
    } while (iVar4 != plVar5->l_used);
  }
  pmVar3 = curwp;
  curwp->w_dotp = plVar2;
  pmVar3->w_doto = iVar1;
  return RVar6;
}

Assistant:

RSIZE
countfword()
{
	RSIZE		 size;
	struct line	*dotp;
	int		 doto;

	dotp = curwp->w_dotp;
	doto = curwp->w_doto;
	size = 0;

	while (inword() != FALSE) {
		if (forwchar(FFRAND, 1) == FALSE)
			/* hit the end of the buffer */
			goto out;
		++size;
	}
out:
	curwp->w_dotp = dotp;
	curwp->w_doto = doto;
	return (size);
}